

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O3

int deal(int signal,double *income,double *balance,double pr)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  
  if (signal == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-------------------------------------------------------------------------",0x49);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Here is the refund:",0x13);
    poVar3 = std::ostream::_M_insert<double>(*income);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"yuan.",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"back",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-------------------------------------------------------------------------",0x49);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    *income = 0.0;
    buttonback();
    iVar1 = -1;
  }
  else {
    if (signal == 0) {
      *balance = *balance - (*income - pr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Here is the charge: ",0x14);
      poVar3 = std::ostream::_M_insert<double>(*income - pr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," yuan.",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Payment is successful! Thank you!",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"back",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      *balance = *balance + *income;
      *income = 0.0;
      buttonback();
    }
    else {
      *balance = *balance + *income;
      *income = 0.0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int deal(int signal, double &income, double &balance, double pr) {
    int isok;
    switch (signal) {
        case 1:
            balance = balance + income;
            income = 0;
            isok = 0;
            break;
        case 0:
            balance = balance - (income - pr);
            frame
            cout << "Here is the charge: " << income - pr << " yuan." << endl;
            cout << "Payment is successful! Thank you!" << endl;
            cout << endl << endl << "back" << endl;
            frame
            balance = balance + income;
            income = 0;
            isok = 0;
            buttonback();
            break;
        case -1:
            frame
            cout << "Here is the refund:" << income << "yuan." << endl;
            cout << endl << endl << "back" << endl;
            frame
            income = 0;
            isok = -1;
            buttonback();
            break;
    }
    return isok;
}